

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O2

void stlez_(double *y,int *n,int *np,int *ns,int *isdeg,int *itdeg,int *robust,int *no,double *rw,
           double *season,double *trend,double *work)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int local_80 [2];
  int c_false;
  int c_true;
  double local_70;
  double *local_68;
  int local_5c;
  uint local_58;
  int ni;
  int local_50;
  uint local_4c;
  int ildeg;
  int newnp;
  int local_40;
  int nljump;
  int nsjump;
  int ntjump;
  
  local_80[0] = 0;
  local_80[1] = 1;
  uVar12 = *np * 2 + *n;
  local_50 = *itdeg;
  local_68 = (double *)CONCAT44(local_68._4_4_,uVar12);
  lVar8 = (long)(int)~uVar12;
  _c_false = y;
  uVar12 = imax(3,*ns);
  ildeg = uVar12 | 1;
  uVar5 = imax(2,*np);
  local_70 = (double)(int)(uVar12 | 1);
  local_4c = uVar5;
  uVar12 = imax(3,(int)(((double)(int)uVar5 * 1.5) / (1.0 - 1.5 / local_70) + 0.5));
  uVar14 = 0;
  local_5c = (*robust == 0) + 1;
  local_58 = uVar5 | 1;
  ni = uVar12 | 1;
  local_40 = imax(1,(int)(local_70 / 10.0 + 0.9));
  nljump = imax(1,(int)((double)(int)(uVar12 | 1) / 10.0 + 0.9));
  newnp = imax(1,(int)((double)(int)(uVar5 | 1) / 10.0 + 0.9));
  uVar9 = (ulong)(uint)*n;
  if (*n < 1) {
    uVar9 = uVar14;
  }
  for (; uVar9 != uVar14; uVar14 = uVar14 + 1) {
    trend[uVar14] = 0.0;
  }
  _nsjump = (uint *)n;
  stlstp_(_c_false,n,(int *)&local_4c,&ildeg,&ni,(int *)&local_58,isdeg,itdeg,&local_50,&local_40,
          &nljump,&newnp,&local_5c,local_80,rw,season,trend,work);
  *no = 0;
  if (*robust == 0) {
    uVar14 = 0;
    uVar9 = (ulong)*_nsjump;
    if ((int)*_nsjump < 1) {
      uVar9 = uVar14;
    }
    for (; uVar9 != uVar14; uVar14 = uVar14 + 1) {
      rw[uVar14] = 1.0;
    }
  }
  else {
    pdVar1 = work + lVar8;
    iVar6 = (int)local_68 * 6;
    lVar13 = (long)((int)local_68 * 7);
    lVar10 = (long)(int)local_68;
    iVar7 = 1;
    local_68 = pdVar1;
    while (iVar7 != 0x10) {
      local_70 = (double)CONCAT44(local_70._4_4_,iVar7);
      uVar9 = (ulong)*_nsjump;
      if ((int)*_nsjump < 1) {
        uVar9 = 0;
      }
      for (lVar11 = 0; uVar9 * 8 != lVar11; lVar11 = lVar11 + 8) {
        *(undefined8 *)((long)work + lVar11 + (long)iVar6 * 8 + lVar8 * 8 + 8) =
             *(undefined8 *)((long)season + lVar11);
        dVar18 = *(double *)((long)trend + lVar11);
        *(double *)((long)work + lVar11 + lVar13 * 8 + lVar8 * 8 + 8) = dVar18;
        *(double *)((long)work + lVar11 + lVar10 * 8 + lVar8 * 8 + 8) =
             dVar18 + *(double *)((long)season + lVar11);
      }
      stlrwt_(_c_false,(int *)_nsjump,work,rw);
      stlstp_(_c_false,(int *)_nsjump,(int *)&local_4c,&ildeg,&ni,(int *)&local_58,isdeg,itdeg,
              &local_50,&local_40,&nljump,&newnp,&local_5c,local_80 + 1,rw,season,trend,work);
      *no = *no + 1;
      dVar18 = local_68[iVar6 + 1];
      dVar17 = local_68[lVar13 + 1];
      dVar16 = ABS(dVar18 - *season);
      dVar15 = ABS(dVar17 - *trend);
      dVar19 = dVar17;
      dVar20 = dVar18;
      for (lVar11 = 2; lVar11 <= (int)*_nsjump; lVar11 = lVar11 + 1) {
        dVar2 = pdVar1[iVar6 + lVar11];
        dVar3 = dVar2;
        if (dVar2 <= dVar20) {
          dVar3 = dVar20;
        }
        dVar20 = dVar3;
        dVar3 = pdVar1[lVar13 + lVar11];
        dVar4 = dVar3;
        if (dVar3 <= dVar19) {
          dVar4 = dVar19;
        }
        dVar19 = dVar4;
        dVar4 = dVar2;
        if (dVar18 <= dVar2) {
          dVar4 = dVar18;
        }
        dVar18 = dVar4;
        dVar4 = dVar3;
        if (dVar17 <= dVar3) {
          dVar4 = dVar17;
        }
        dVar17 = dVar4;
        dVar4 = ABS(dVar2 - season[lVar11 + -1]);
        if (ABS(dVar2 - season[lVar11 + -1]) <= dVar16) {
          dVar4 = dVar16;
        }
        dVar16 = dVar4;
        dVar2 = ABS(dVar3 - trend[lVar11 + -1]);
        if (ABS(dVar3 - trend[lVar11 + -1]) <= dVar15) {
          dVar2 = dVar15;
        }
        dVar15 = dVar2;
      }
      if ((dVar16 / (dVar20 - dVar18) < 0.01) && (dVar15 / (dVar19 - dVar17) < 0.01)) {
        return;
      }
      iVar7 = local_70._0_4_ + 1;
    }
  }
  return;
}

Assistant:

void stlez_(double *y, int *n, int *np, int *ns, int *isdeg, int *itdeg,int *robust, int *no, 
	double *rw, double *season, double *trend, double *work)
{
    /* System generated locals */
    int work_dim1, work_offset, i__1, i__2;
    double d__1;

    /* Local variables */
    int i__, j, ni, nl, nt;
    double difs, dift, mins, mint, maxs, maxt;
    int ildeg;
    double maxds, maxdt;
    int newnp, newns, nljump, nsjump, ntjump;
	int c_false = 0;
	int c_true = 1;

		// Robust

/* Arg */
/* Var */
    /* Parameter adjustments */
    --trend;
    --season;
    --rw;
    --y;
    work_dim1 = *n + 2 * *np;
    work_offset = 1 + work_dim1;
    work -= work_offset;

    /* Function Body */
    ildeg = *itdeg;
    newns = imax(3,*ns);
    if (newns % 2 == 0) {
	++newns;
    }
    newnp = imax(2,*np);
    nt = newnp * 1.5 / (1 - 1.5 / newns) + .5;
    nt = imax(3,nt);
    if (nt % 2 == 0) {
	++nt;
    }
    nl = newnp;
    if (nl % 2 == 0) {
	++nl;
    }
    if (*robust) {
	ni = 1;
    } else {
	ni = 2;
    }
/* Computing MAX */
    i__1 = 1, i__2 = (int) ((double) newns / 10 + .9);
    nsjump = imax(i__1,i__2);
/* Computing MAX */
    i__1 = 1, i__2 = (int) ((double) nt / 10 + .9);
    ntjump = imax(i__1,i__2);
/* Computing MAX */
    i__1 = 1, i__2 = (int) ((double) nl / 10 + .9);
    nljump = imax(i__1,i__2);
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	trend[i__] = 0.0;
/* L2: */
    }
    stlstp_(&y[1], n, &newnp, &newns, &nt, &nl, isdeg, itdeg, &ildeg, &nsjump,
	     &ntjump, &nljump, &ni, &c_false, &rw[1], &season[1], &trend[1], &
	    work[work_offset]);
    *no = 0;
    if (*robust) {
	j = 1;
/*        Loop  --- 15 robustness iterations */
L100:
	if (j <= 15) {
	    i__1 = *n;
	    for (i__ = 1; i__ <= i__1; ++i__) {
		work[i__ + work_dim1 * 6] = season[i__];
		work[i__ + work_dim1 * 7] = trend[i__];
		work[i__ + work_dim1] = trend[i__] + season[i__];
/* L35: */
	    }
	    stlrwt_(&y[1], n, &work[work_dim1 + 1], &rw[1]);
	    stlstp_(&y[1], n, &newnp, &newns, &nt, &nl, isdeg, itdeg, &ildeg, 
		    &nsjump, &ntjump, &nljump, &ni, &c_true, &rw[1], &season[
		    1], &trend[1], &work[work_offset]);
	    ++(*no);
	    maxs = work[work_dim1 * 6 + 1];
	    mins = work[work_dim1 * 6 + 1];
	    maxt = work[work_dim1 * 7 + 1];
	    mint = work[work_dim1 * 7 + 1];
	    maxds = (d__1 = work[work_dim1 * 6 + 1] - season[1], fabs(d__1));
	    maxdt = (d__1 = work[work_dim1 * 7 + 1] - trend[1], fabs(d__1));
	    i__1 = *n;
	    for (i__ = 2; i__ <= i__1; ++i__) {
		if (maxs < work[i__ + work_dim1 * 6]) {
		    maxs = work[i__ + work_dim1 * 6];
		}
		if (maxt < work[i__ + work_dim1 * 7]) {
		    maxt = work[i__ + work_dim1 * 7];
		}
		if (mins > work[i__ + work_dim1 * 6]) {
		    mins = work[i__ + work_dim1 * 6];
		}
		if (mint > work[i__ + work_dim1 * 7]) {
		    mint = work[i__ + work_dim1 * 7];
		}
		difs = (d__1 = work[i__ + work_dim1 * 6] - season[i__], fabs(
			d__1));
		dift = (d__1 = work[i__ + work_dim1 * 7] - trend[i__], fabs(
			d__1));
		if (maxds < difs) {
		    maxds = difs;
		}
		if (maxdt < dift) {
		    maxdt = dift;
		}
/* L137: */
	    }
	    if (maxds / (maxs - mins) < .01 && maxdt / (maxt - mint) < .01) 
		    {
		goto L300;
	    }
/* L151: */
	    ++j;
	    goto L100;
	}
/*        end Loop */
L300:
	;
    } else {
/*     	.not. robust */
	i__1 = *n;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    rw[i__] = 1.0;
/* L150: */
	}
    }
}